

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerQueue.h
# Opt level: O2

void __thiscall
WorkerQueue<ReadMergerWorker<DNA>,_std::pair<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>_>,_WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*>
::Enqueue(WorkerQueue<ReadMergerWorker<DNA>,_std::pair<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>_>,_WorkerQueue<MergedReadWriterWorker<DNA>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>_*>
          *this,pair<std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>,_std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>_>
                *queueItem)

{
  size_type sVar1;
  undefined1 local_28 [8];
  unique_lock<std::mutex> lock;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)local_28,(mutex_type *)(this + 0x80));
  sVar1 = std::deque<Sequence<DNA>,_std::allocator<Sequence<DNA>_>_>::size(&queueItem->first);
  *(size_type *)(this + 0x100) = *(long *)(this + 0x100) + sVar1;
  std::
  deque<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>,std::allocator<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>>>
  ::
  emplace_back<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>>
            ((deque<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>,std::allocator<std::pair<std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>,std::deque<Sequence<DNA>,std::allocator<Sequence<DNA>>>>>>
              *)(this + 0xb0),queueItem);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void Enqueue( QueueItem& queueItem ) {
    {
      std::unique_lock< std::mutex > lock( mQueueMutex );
      mTotalEnqueued += QueueItemInfo< QueueItem >::Count( queueItem );
      mQueue.push( std::move( queueItem ) );
    }

    // Send one worker to work
    mCondition.notify_one();
  }